

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

QTextFrame * __thiscall QTextDocumentPrivate::frameAt(QTextDocumentPrivate *this,int pos)

{
  QTextFrame *pQVar1;
  int unaff_retaddr;
  QTextFrame *c;
  QTextFrame *f;
  QTextDocumentPrivate *in_stack_ffffffffffffffe8;
  QTextFrame *pQVar2;
  
  pQVar1 = rootFrame(in_stack_ffffffffffffffe8);
  do {
    pQVar2 = pQVar1;
    pQVar1 = findChildFrame(c,unaff_retaddr);
  } while (pQVar1 != (QTextFrame *)0x0);
  return pQVar2;
}

Assistant:

QTextFrame *QTextDocumentPrivate::frameAt(int pos) const
{
    QTextFrame *f = rootFrame();

    while (1) {
        QTextFrame *c = findChildFrame(f, pos);
        if (!c)
            return f;
        f = c;
    }
}